

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_kernel_1.cpp
# Opt level: O2

void dlib::assign_tables<dlib::logger::global_data::auto_flush_container,bool>
               (auto_flush_container *c,string *name,bool *val)

{
  kernel_1b_c *this;
  bool bVar1;
  long lVar2;
  range *prVar3;
  __uniq_ptr_data<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>,_true,_true>
  c_00;
  unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
  temp;
  string last;
  string first;
  
  if (name->_M_string_length != 0) {
    lVar2 = std::__cxx11::string::find_first_of((char *)name,0x2d96b4);
    std::__cxx11::string::substr((ulong)&first,(ulong)name);
    last._M_dataplus._M_p = (pointer)&last.field_2;
    last._M_string_length = 0;
    last.field_2._M_local_buf[0] = '\0';
    if (lVar2 != -1) {
      std::__cxx11::string::substr((ulong)&temp,(ulong)name);
      std::__cxx11::string::operator=((string *)&last,(string *)&temp);
      std::__cxx11::string::~string((string *)&temp);
    }
    this = &c->table;
    bVar1 = map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            ::is_in_domain(&this->
                            super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                           ,&first);
    if (bVar1) {
      prVar3 = map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
               ::operator[](this,&first);
      assign_tables<dlib::logger::global_data::auto_flush_container,bool>
                ((prVar3->_M_t).
                 super___uniq_ptr_impl<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_dlib::logger::global_data::auto_flush_container_*,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
                 .super__Head_base<0UL,_dlib::logger::global_data::auto_flush_container_*,_false>.
                 _M_head_impl,&last,val);
    }
    else {
      c_00.
      super___uniq_ptr_impl<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
      ._M_t.
      super__Tuple_impl<0UL,_dlib::logger::global_data::auto_flush_container_*,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
      .super__Head_base<0UL,_dlib::logger::global_data::auto_flush_container_*,_false>._M_head_impl
           = (__uniq_ptr_impl<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
              )operator_new(0x78);
      map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
      ::map_kernel_c((kernel_1b_c *)
                     ((long)c_00.
                            super___uniq_ptr_impl<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_dlib::logger::global_data::auto_flush_container_*,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
                            .
                            super__Head_base<0UL,_dlib::logger::global_data::auto_flush_container_*,_false>
                            ._M_head_impl + 8));
      *(bool *)c_00.
               super___uniq_ptr_impl<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
               ._M_t.
               super__Tuple_impl<0UL,_dlib::logger::global_data::auto_flush_container_*,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
               .super__Head_base<0UL,_dlib::logger::global_data::auto_flush_container_*,_false>.
               _M_head_impl = c->val;
      temp._M_t.
      super___uniq_ptr_impl<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
      ._M_t.
      super__Tuple_impl<0UL,_dlib::logger::global_data::auto_flush_container_*,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
      .super__Head_base<0UL,_dlib::logger::global_data::auto_flush_container_*,_false>._M_head_impl
           = (__uniq_ptr_data<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>,_true,_true>
              )(__uniq_ptr_data<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>,_true,_true>
                )c_00.
                 super___uniq_ptr_impl<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_dlib::logger::global_data::auto_flush_container_*,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
                 .super__Head_base<0UL,_dlib::logger::global_data::auto_flush_container_*,_false>.
                 _M_head_impl;
      assign_tables<dlib::logger::global_data::auto_flush_container,bool>
                ((auto_flush_container *)
                 c_00.
                 super___uniq_ptr_impl<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_dlib::logger::global_data::auto_flush_container_*,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
                 .super__Head_base<0UL,_dlib::logger::global_data::auto_flush_container_*,_false>.
                 _M_head_impl,&last,val);
      map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
      ::add(this,&first,&temp);
      std::
      unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
      ::~unique_ptr(&temp);
    }
    std::__cxx11::string::~string((string *)&last);
    std::__cxx11::string::~string((string *)&first);
    return;
  }
  c->val = *val;
  binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(c->table).
           super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
           .bst);
  return;
}

Assistant:

void assign_tables (
        T& c,
        const std::string& name,
        const U& val
    )
    {
        if (name.size() == 0)
        {
            c.val = val;
            c.table.clear();
            return;
        }

        const std::string::size_type pos = name.find_first_of(".");
        std::string first = name.substr(0,pos);
        std::string last;
        if (pos != std::string::npos)
            last = name.substr(pos+1);

        if (c.table.is_in_domain(first))
        {
            assign_tables(*c.table[first], last, val); 
        }
        else
        {
            std::unique_ptr<T> temp (new T);
            temp->val = c.val;
            assign_tables(*temp, last, val);
            c.table.add(first,temp);
        }
    }